

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s128_256_1280(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  long in_RDX;
  word *in_RSI;
  ulong *in_RDI;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  block_t *cblock5;
  block_t *cblock4;
  block_t *cblock3;
  block_t *cblock2;
  block_t *cblock1;
  word128 mask;
  uint i;
  word idx;
  uint w;
  word128 cval [10];
  block_t *Ablock;
  word *vptr;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  int local_54c;
  word local_548;
  int local_53c;
  ulong local_538 [21];
  long local_490;
  word *local_488;
  ulong *local_470;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  uint local_280;
  undefined4 local_27c;
  ulong local_278;
  ulong uStack_270;
  long local_260;
  ulong *local_258;
  undefined1 (*local_250) [16];
  undefined1 local_248 [16];
  ulong local_238;
  ulong uStack_230;
  uint local_220;
  undefined4 local_21c;
  ulong local_218;
  ulong uStack_210;
  long local_200;
  ulong *local_1f8;
  undefined1 (*local_1f0) [16];
  undefined1 local_1e8 [16];
  ulong local_1d8;
  ulong uStack_1d0;
  uint local_1c0;
  undefined4 local_1bc;
  ulong local_1b8;
  ulong uStack_1b0;
  long local_1a0;
  ulong *local_198;
  undefined1 (*local_190) [16];
  undefined1 local_188 [16];
  ulong local_178;
  ulong uStack_170;
  uint local_160;
  undefined4 local_15c;
  ulong local_158;
  ulong uStack_150;
  long local_140;
  ulong *local_138;
  undefined1 (*local_130) [16];
  undefined1 local_128 [16];
  ulong local_118;
  ulong uStack_110;
  uint local_100;
  undefined4 local_fc;
  ulong local_f8;
  ulong uStack_f0;
  long local_e0;
  ulong *local_d8;
  undefined1 (*local_d0) [16];
  undefined1 local_c8 [16];
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_298 = (undefined1  [16])0x0;
  local_538[0] = 0;
  local_538[1] = 0;
  local_2a8 = (undefined1  [16])0x0;
  local_538[2] = 0;
  local_538[3] = 0;
  local_2b8 = (undefined1  [16])0x0;
  local_538[4] = 0;
  local_538[5] = 0;
  local_2c8 = (undefined1  [16])0x0;
  local_538[6] = 0;
  local_538[7] = 0;
  local_2d8 = (undefined1  [16])0x0;
  local_538[8] = 0;
  local_538[9] = 0;
  local_2e8 = (undefined1  [16])0x0;
  local_538[10] = 0;
  local_538[0xb] = 0;
  local_2f8 = (undefined1  [16])0x0;
  local_538[0xc] = 0;
  local_538[0xd] = 0;
  local_308 = (undefined1  [16])0x0;
  local_538[0xe] = 0;
  local_538[0xf] = 0;
  local_318 = (undefined1  [16])0x0;
  local_538[0x10] = 0;
  local_538[0x11] = 0;
  local_328 = (undefined1  [16])0x0;
  local_328._0_8_ = 0;
  local_328._8_8_ = 0;
  local_538[0x12] = 0;
  local_538[0x13] = 0;
  uVar20 = local_328._0_8_;
  uVar22 = local_328._8_8_;
  local_490 = in_RDX;
  local_488 = in_RSI;
  local_470 = in_RDI;
  for (local_53c = 4; local_53c != 0; local_53c = local_53c + -1) {
    local_548 = *local_488;
    for (local_54c = 0x40; local_54c != 0; local_54c = local_54c + -1) {
      uVar21 = uVar20;
      uVar23 = uVar22;
      mm128_compute_mask(local_548,0);
      lVar1 = local_490;
      local_fc = 2;
      for (local_100 = 0; local_100 != 2; local_100 = local_100 + 1) {
        uVar20 = local_538[(ulong)local_100 * 2];
        uVar22 = local_538[(ulong)local_100 * 2 + 1];
        pauVar11 = (undefined1 (*) [16])(local_490 + (ulong)local_100 * 0x10);
        uVar5 = *(undefined8 *)*pauVar11;
        uVar6 = *(undefined8 *)(*pauVar11 + 8);
        auVar7._8_8_ = uVar23;
        auVar7._0_8_ = uVar21;
        auVar2 = vpand_avx(*pauVar11,auVar7);
        local_c8._0_8_ = auVar2._0_8_;
        local_c8._8_8_ = auVar2._8_8_;
        local_538[(ulong)local_100 * 2] = uVar20 ^ local_c8._0_8_;
        local_538[(ulong)local_100 * 2 + 1] = uVar22 ^ local_c8._8_8_;
        local_d0 = pauVar11;
        local_c8 = auVar2;
        local_b8 = uVar20;
        uStack_b0 = uVar22;
        local_a8 = uVar21;
        uStack_a0 = uVar23;
        local_98 = uVar5;
        uStack_90 = uVar6;
      }
      puVar16 = local_538 + 4;
      lVar12 = local_490 + 0x20;
      local_15c = 2;
      for (local_160 = 0; local_160 != 2; local_160 = local_160 + 1) {
        uVar20 = puVar16[(ulong)local_160 * 2];
        uVar22 = local_538[(ulong)local_160 * 2 + 5];
        pauVar11 = (undefined1 (*) [16])(lVar12 + (ulong)local_160 * 0x10);
        uVar5 = *(undefined8 *)*pauVar11;
        uVar6 = *(undefined8 *)(*pauVar11 + 8);
        auVar8._8_8_ = uVar23;
        auVar8._0_8_ = uVar21;
        auVar2 = vpand_avx(*pauVar11,auVar8);
        local_128._0_8_ = auVar2._0_8_;
        local_128._8_8_ = auVar2._8_8_;
        puVar16[(ulong)local_160 * 2] = uVar20 ^ local_128._0_8_;
        local_538[(ulong)local_160 * 2 + 5] = uVar22 ^ local_128._8_8_;
        local_130 = pauVar11;
        local_128 = auVar2;
        local_118 = uVar20;
        uStack_110 = uVar22;
        local_88 = uVar21;
        uStack_80 = uVar23;
        local_78 = uVar5;
        uStack_70 = uVar6;
      }
      puVar17 = local_538 + 8;
      lVar13 = local_490 + 0x40;
      local_1bc = 2;
      for (local_1c0 = 0; local_1c0 != 2; local_1c0 = local_1c0 + 1) {
        uVar20 = puVar17[(ulong)local_1c0 * 2];
        uVar22 = local_538[(ulong)local_1c0 * 2 + 9];
        pauVar11 = (undefined1 (*) [16])(lVar13 + (ulong)local_1c0 * 0x10);
        uVar5 = *(undefined8 *)*pauVar11;
        uVar6 = *(undefined8 *)(*pauVar11 + 8);
        auVar9._8_8_ = uVar23;
        auVar9._0_8_ = uVar21;
        auVar2 = vpand_avx(*pauVar11,auVar9);
        local_188._0_8_ = auVar2._0_8_;
        local_188._8_8_ = auVar2._8_8_;
        puVar17[(ulong)local_1c0 * 2] = uVar20 ^ local_188._0_8_;
        local_538[(ulong)local_1c0 * 2 + 9] = uVar22 ^ local_188._8_8_;
        local_190 = pauVar11;
        local_188 = auVar2;
        local_178 = uVar20;
        uStack_170 = uVar22;
        local_68 = uVar21;
        uStack_60 = uVar23;
        local_58 = uVar5;
        uStack_50 = uVar6;
      }
      puVar18 = local_538 + 0xc;
      lVar14 = local_490 + 0x60;
      local_21c = 2;
      for (local_220 = 0; local_220 != 2; local_220 = local_220 + 1) {
        uVar20 = puVar18[(ulong)local_220 * 2];
        uVar22 = local_538[(ulong)local_220 * 2 + 0xd];
        pauVar11 = (undefined1 (*) [16])(lVar14 + (ulong)local_220 * 0x10);
        uVar5 = *(undefined8 *)*pauVar11;
        uVar6 = *(undefined8 *)(*pauVar11 + 8);
        auVar10._8_8_ = uVar23;
        auVar10._0_8_ = uVar21;
        auVar2 = vpand_avx(*pauVar11,auVar10);
        local_1e8._0_8_ = auVar2._0_8_;
        local_1e8._8_8_ = auVar2._8_8_;
        puVar18[(ulong)local_220 * 2] = uVar20 ^ local_1e8._0_8_;
        local_538[(ulong)local_220 * 2 + 0xd] = uVar22 ^ local_1e8._8_8_;
        local_1f0 = pauVar11;
        local_1e8 = auVar2;
        local_1d8 = uVar20;
        uStack_1d0 = uVar22;
        local_48 = uVar21;
        uStack_40 = uVar23;
        local_38 = uVar5;
        uStack_30 = uVar6;
      }
      puVar19 = local_538 + 0x10;
      lVar15 = local_490 + 0x80;
      local_27c = 2;
      uVar20 = uVar21;
      uVar22 = uVar23;
      for (local_280 = 0; local_280 != 2; local_280 = local_280 + 1) {
        uVar3 = puVar19[(ulong)local_280 * 2];
        uVar4 = local_538[(ulong)local_280 * 2 + 0x11];
        pauVar11 = (undefined1 (*) [16])(lVar15 + (ulong)local_280 * 0x10);
        uVar5 = *(undefined8 *)*pauVar11;
        uVar6 = *(undefined8 *)(*pauVar11 + 8);
        auVar2._8_8_ = uVar23;
        auVar2._0_8_ = uVar21;
        auVar2 = vpand_avx(*pauVar11,auVar2);
        local_248._0_8_ = auVar2._0_8_;
        local_248._8_8_ = auVar2._8_8_;
        uVar20 = uVar3 ^ local_248._0_8_;
        uVar22 = uVar4 ^ local_248._8_8_;
        puVar19[(ulong)local_280 * 2] = uVar20;
        local_538[(ulong)local_280 * 2 + 0x11] = uVar22;
        local_250 = pauVar11;
        local_248 = auVar2;
        local_238 = uVar3;
        uStack_230 = uVar4;
        local_28 = uVar21;
        uStack_20 = uVar23;
        local_18 = uVar5;
        uStack_10 = uVar6;
      }
      local_548 = local_548 >> 1;
      local_490 = local_490 + 0xa0;
      local_278 = uVar21;
      uStack_270 = uVar23;
      local_260 = lVar15;
      local_258 = puVar19;
      local_218 = uVar21;
      uStack_210 = uVar23;
      local_200 = lVar14;
      local_1f8 = puVar18;
      local_1b8 = uVar21;
      uStack_1b0 = uVar23;
      local_1a0 = lVar13;
      local_198 = puVar17;
      local_158 = uVar21;
      uStack_150 = uVar23;
      local_140 = lVar12;
      local_138 = puVar16;
      local_f8 = uVar21;
      uStack_f0 = uVar23;
      local_e0 = lVar1;
      local_d8 = local_538;
    }
    local_488 = local_488 + 1;
  }
  *local_470 = local_538[0];
  local_470[1] = local_538[1];
  local_470[2] = local_538[2];
  local_470[3] = local_538[3];
  local_470[4] = local_538[4];
  local_470[5] = local_538[5];
  local_470[6] = local_538[6];
  local_470[7] = local_538[7];
  local_470[8] = local_538[8];
  local_470[9] = local_538[9];
  local_470[10] = local_538[10];
  local_470[0xb] = local_538[0xb];
  local_470[0xc] = local_538[0xc];
  local_470[0xd] = local_538[0xd];
  local_470[0xe] = local_538[0xe];
  local_470[0xf] = local_538[0xf];
  local_470[0x10] = local_538[0x10];
  local_470[0x11] = local_538[0x11];
  local_470[0x12] = local_538[0x12];
  local_470[0x13] = local_538[0x13];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_256_1280(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[10] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                      mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 5) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
      mm128_xor_mask_region(&cval[8], Ablock[4].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  block_t* cblock5 = BLOCK(c, 4);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
  mm128_store(&cblock5->w64[0], cval[8]);
  mm128_store(&cblock5->w64[2], cval[9]);
}